

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver6L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                   *__return_storage_ptr__,
                  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          *plPair,
                  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                  *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                         *lCPair)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer ppVar5;
  iterator __position;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar16;
  iterator iVar17;
  bool bVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  Matrix<double,_6,_1,_0,_6,_1> L61;
  Matrix<double,_6,_1,_0,_6,_1> L52;
  Matrix<double,_6,_1,_0,_6,_1> L51;
  Matrix<double,_6,_1,_0,_6,_1> L42;
  Matrix<double,_6,_1,_0,_6,_1> L41;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Matrix<double,_3,_1,_0,_3,_1> R62_B;
  Matrix<double,_3,_1,_0,_3,_1> R61_B;
  Matrix<double,_3,_1,_0,_3,_1> Q62;
  Matrix<double,_3,_1,_0,_3,_1> Q61;
  Matrix<double,_3,_1,_0,_3,_1> R52_B;
  Matrix<double,_3,_1,_0,_3,_1> R51_B;
  Matrix<double,_3,_1,_0,_3,_1> Q52;
  Matrix<double,_3,_1,_0,_3,_1> Q51;
  Matrix<double,_3,_1,_0,_3,_1> R42_B;
  Matrix<double,_3,_1,_0,_3,_1> R41_B;
  Matrix<double,_3,_1,_0,_3,_1> Q42;
  Matrix<double,_3,_1,_0,_3,_1> Q41;
  Matrix<double,_3,_1,_0,_3,_1> R32_B;
  Matrix<double,_3,_1,_0,_3,_1> R31_B;
  Matrix<double,_3,_1,_0,_3,_1> Q32;
  Matrix<double,_3,_1,_0,_3,_1> Q31;
  Matrix<double,_3,_1,_0,_3,_1> R22_B;
  Matrix<double,_3,_1,_0,_3,_1> R21_B;
  Matrix<double,_3,_1,_0,_3,_1> Q22;
  Matrix<double,_3,_1,_0,_3,_1> Q21;
  Matrix<double,_3,_1,_0,_3,_1> R12_B;
  Matrix<double,_3,_1,_0,_3,_1> R11_B;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  Matrix<double,_6,_1,_0,_6,_1> L62;
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_4,_4,_0,_4,_4> TransformationEstimate;
  Matrix<double,_6,_1,_0,_6,_1> k;
  Matrix<double,_3,_1,_0,_3,_1> Q12;
  Matrix<double,_3,_1,_0,_3,_1> Q11;
  Matrix<double,_3,_1,_0,_3,_1> solution;
  Matrix<double,_6,_3,_0,_6,_3> A;
  Matrix<double,_64,_64,_0,_64,_64> Action;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_416f8;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_416d8;
  undefined1 auStack_416b8 [16];
  undefined1 auStack_416a8 [16];
  undefined1 auStack_41698 [16];
  undefined1 auStack_41688 [16];
  undefined1 auStack_41678 [16];
  undefined1 auStack_41668 [16];
  undefined1 auStack_41658 [16];
  undefined1 auStack_41648 [16];
  undefined1 auStack_41638 [16];
  undefined1 auStack_41628 [16];
  undefined1 auStack_41618 [16];
  undefined1 auStack_41608 [16];
  undefined1 auStack_415f8 [16];
  undefined1 auStack_415e8 [16];
  undefined1 auStack_415d8 [16];
  undefined1 auStack_415c8 [16];
  undefined1 auStack_415b8 [16];
  undefined1 auStack_415a8 [16];
  undefined1 auStack_41598 [16];
  undefined1 auStack_41588 [16];
  undefined1 auStack_41578 [16];
  undefined1 auStack_41568 [16];
  undefined1 auStack_41558 [16];
  undefined1 auStack_41548 [16];
  undefined1 auStack_41538 [16];
  undefined1 auStack_41528 [16];
  undefined1 auStack_41518 [16];
  undefined1 auStack_41508 [16];
  undefined1 auStack_414f8 [16];
  undefined1 auStack_414e8 [16];
  undefined1 auStack_414d8 [16];
  undefined1 auStack_414c8 [16];
  undefined1 auStack_414b8 [16];
  double dStack_414a8;
  double dStack_414a0;
  double dStack_41498;
  double dStack_41488;
  double dStack_41480;
  double dStack_41478;
  undefined8 uStack_41468;
  double dStack_41460;
  double dStack_41458;
  undefined8 uStack_41448;
  double dStack_41440;
  double dStack_41438;
  undefined8 uStack_41428;
  double dStack_41420;
  double dStack_41418;
  undefined8 uStack_41408;
  double dStack_41400;
  double dStack_413f8;
  undefined8 uStack_413e8;
  double dStack_413e0;
  double dStack_413d8;
  undefined8 uStack_413c8;
  double dStack_413c0;
  double dStack_413b8;
  undefined8 uStack_413a8;
  double dStack_413a0;
  double dStack_41398;
  undefined8 uStack_41388;
  double dStack_41380;
  double dStack_41378;
  undefined8 uStack_41368;
  double dStack_41360;
  double dStack_41358;
  undefined8 uStack_41348;
  double dStack_41340;
  double dStack_41338;
  undefined8 uStack_41328;
  double dStack_41320;
  double dStack_41318;
  undefined8 uStack_41308;
  double dStack_41300;
  double dStack_412f8;
  undefined8 uStack_412e8;
  double dStack_412e0;
  double dStack_412d8;
  undefined8 uStack_412c8;
  double dStack_412c0;
  double dStack_412b8;
  undefined8 uStack_412a8;
  double dStack_412a0;
  double dStack_41298;
  undefined8 uStack_41288;
  double dStack_41280;
  double dStack_41278;
  undefined8 uStack_41268;
  double dStack_41260;
  double dStack_41258;
  undefined8 uStack_41248;
  double dStack_41240;
  double dStack_41238;
  undefined8 uStack_41228;
  double dStack_41220;
  double dStack_41218;
  undefined8 uStack_41208;
  double dStack_41200;
  double dStack_411f8;
  SrcXprType SStack_411f0;
  double *pdStack_411e0;
  double dStack_411d8;
  double dStack_411d0;
  double dStack_411c8;
  double dStack_411c0;
  double dStack_411b8;
  double adStack_411b0 [5];
  Data DStack_41188;
  undefined8 uStack_41170;
  undefined8 uStack_41168;
  undefined8 uStack_41160;
  Data DStack_41158;
  undefined8 uStack_41140;
  undefined8 uStack_41138;
  undefined8 uStack_41130;
  Data DStack_41128;
  undefined8 uStack_41110;
  undefined8 uStack_41108;
  undefined8 uStack_41100;
  Data DStack_410f8;
  undefined8 uStack_410e0;
  undefined8 uStack_410d8;
  undefined8 uStack_410d0;
  Data DStack_410c8;
  undefined8 uStack_410b0;
  undefined8 uStack_410a8;
  undefined8 uStack_410a0;
  undefined1 auStack_41098 [16];
  undefined1 auStack_41088 [16];
  undefined1 auStack_41078 [16];
  undefined1 auStack_41068 [16];
  undefined1 auStack_41058 [16];
  undefined1 auStack_41048 [16];
  double adStack_41038 [4];
  double dStack_41018;
  double dStack_41010;
  double dStack_41008;
  double dStack_41000;
  double dStack_40ff8;
  double dStack_40ff0;
  double dStack_40fe8;
  double dStack_40fe0;
  double dStack_40fd8;
  double dStack_40fd0;
  double dStack_40fc8;
  double dStack_40fc0;
  double dStack_40fb8;
  double adStack_40fb0 [5];
  undefined1 auStack_40f88 [8];
  double adStack_40f80 [4];
  undefined8 uStack_40f60;
  Data DStack_40f58;
  undefined8 uStack_40f40;
  undefined8 uStack_40f38;
  undefined8 uStack_40f30;
  Data DStack_40f28;
  undefined8 uStack_40f10;
  undefined8 uStack_40f08;
  undefined8 uStack_40f00;
  Data DStack_40ef8;
  undefined8 uStack_40ee0;
  undefined8 uStack_40ed8;
  undefined8 uStack_40ed0;
  Data DStack_40ec8;
  undefined8 uStack_40eb0;
  undefined8 uStack_40ea8;
  undefined8 uStack_40ea0;
  Data DStack_40e98;
  undefined8 uStack_40e80;
  double adStack_40e78 [2];
  Matrix<double,_4,_4,_0,_4,_4> MStack_40e68;
  double adStack_40de8 [6];
  double dStack_40db8;
  double dStack_40db0;
  double dStack_40da8;
  double dStack_40d98;
  double dStack_40d90;
  double dStack_40d88;
  Matrix<double,_3,_1,_0,_3,_1> MStack_40d80;
  Matrix<double,_3,_3,_0,_3,_3> MStack_40d68;
  non_const_type pMStack_40d20;
  double adStack_40cf8 [6];
  double adStack_40cc8 [6];
  double adStack_40c98 [6];
  Matrix<double,_64,_64,_0,_64,_64> MStack_40c68;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> EStack_38c68;
  undefined1 auStack_10038 [16];
  assign_op<double,_double> *paStack_10028;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *pEStack_10020;
  undefined8 local_fc70 [5];
  undefined8 auStack_fc48 [8067];
  
  bVar22 = 0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar5 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dStack_40d98 = *(double *)
                  &(ppVar5->first).first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_40d90 = *(double *)
                  ((long)&(ppVar5->first).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&dStack_40d98;
  dStack_40d88 = *(double *)
                  ((long)&(ppVar5->first).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_40db8 = (ppVar5->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_40db0 = *(double *)
                  ((long)&(ppVar5->first).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&dStack_40db8;
  dStack_40da8 = *(double *)
                  ((long)&(ppVar5->first).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41208 = *(undefined8 *)
                  &(ppVar5->second).first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41200 = *(double *)
                  ((long)&(ppVar5->second).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_411f8 = *(double *)
                  ((long)&(ppVar5->second).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41228 = (ppVar5->second).second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41220 = *(double *)
                  ((long)&(ppVar5->second).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41218 = *(double *)
                  ((long)&(ppVar5->second).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41248 = *(undefined8 *)
                  &ppVar5[1].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41240 = *(double *)
                  ((long)&ppVar5[1].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41238 = *(double *)
                  ((long)&ppVar5[1].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41268 = ppVar5[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41260 = *(double *)
                  ((long)&ppVar5[1].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41258 = *(double *)
                  ((long)&ppVar5[1].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41288 = *(undefined8 *)
                  &ppVar5[1].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41280 = *(double *)
                  ((long)&ppVar5[1].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41278 = *(double *)
                  ((long)&ppVar5[1].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_412a8 = ppVar5[1].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_412a0 = *(double *)
                  ((long)&ppVar5[1].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41298 = *(double *)
                  ((long)&ppVar5[1].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_412c8 = *(undefined8 *)
                  &ppVar5[2].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_412c0 = *(double *)
                  ((long)&ppVar5[2].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_412b8 = *(double *)
                  ((long)&ppVar5[2].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_412e8 = ppVar5[2].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_412e0 = *(double *)
                  ((long)&ppVar5[2].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_412d8 = *(double *)
                  ((long)&ppVar5[2].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41308 = *(undefined8 *)
                  &ppVar5[2].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41300 = *(double *)
                  ((long)&ppVar5[2].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_412f8 = *(double *)
                  ((long)&ppVar5[2].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41328 = ppVar5[2].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41320 = *(double *)
                  ((long)&ppVar5[2].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41318 = *(double *)
                  ((long)&ppVar5[2].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41348 = *(undefined8 *)
                  &ppVar5[3].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41340 = *(double *)
                  ((long)&ppVar5[3].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41338 = *(double *)
                  ((long)&ppVar5[3].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41368 = ppVar5[3].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41360 = *(double *)
                  ((long)&ppVar5[3].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41358 = *(double *)
                  ((long)&ppVar5[3].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41388 = *(undefined8 *)
                  &ppVar5[3].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41380 = *(double *)
                  ((long)&ppVar5[3].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41378 = *(double *)
                  ((long)&ppVar5[3].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_413a8 = ppVar5[3].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_413a0 = *(double *)
                  ((long)&ppVar5[3].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41398 = *(double *)
                  ((long)&ppVar5[3].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_413c8 = *(undefined8 *)
                  &ppVar5[4].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_413c0 = *(double *)
                  ((long)&ppVar5[4].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_413b8 = *(double *)
                  ((long)&ppVar5[4].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_413e8 = ppVar5[4].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_413e0 = *(double *)
                  ((long)&ppVar5[4].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_413d8 = *(double *)
                  ((long)&ppVar5[4].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41408 = *(undefined8 *)
                  &ppVar5[4].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41400 = *(double *)
                  ((long)&ppVar5[4].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_413f8 = *(double *)
                  ((long)&ppVar5[4].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41428 = ppVar5[4].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41420 = *(double *)
                  ((long)&ppVar5[4].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41418 = *(double *)
                  ((long)&ppVar5[4].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41448 = *(undefined8 *)
                  &ppVar5[5].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41440 = *(double *)
                  ((long)&ppVar5[5].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41438 = *(double *)
                  ((long)&ppVar5[5].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  uStack_41468 = ppVar5[5].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41460 = *(double *)
                  ((long)&ppVar5[5].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41458 = *(double *)
                  ((long)&ppVar5[5].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41488 = *(double *)
                  &ppVar5[5].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41480 = *(double *)
                  ((long)&ppVar5[5].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41478 = *(double *)
                  ((long)&ppVar5[5].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_414a8 = ppVar5[5].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_414a0 = *(double *)
                  ((long)&ppVar5[5].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41498 = *(double *)
                  ((long)&ppVar5[5].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1] = 0.0;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[2] = 4.94065645841247e-324;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[3] = 1.48219693752374e-323;
  pEStack_10020 = &EStack_38c68;
  auStack_40f88 = (undefined1  [8])auStack_414d8;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0] = (double)auStack_414d8;
  auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
  auStack_10038._8_8_ = &DStack_41188;
  paStack_10028 = (assign_op<double,_double> *)adStack_41038;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)auStack_10038);
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
  if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
             .m_data.array[3] +
       (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
             .m_data.array[1] == 6) &&
     (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[2] == 4.94065645841247e-324)) {
    auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_414d8;
    auVar23._0_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
         ::
         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                     *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                     *)&EStack_38c68);
    auVar23._8_8_ = 0;
    auVar23 = sqrtpd(auVar23,auVar23);
    auVar24._0_8_ = auVar23._0_8_;
    auVar24._8_8_ = auVar24._0_8_;
    auStack_414d8 = divpd(auStack_414d8,auVar24);
    auStack_414c8 = divpd(auStack_414c8,auVar24);
    auStack_414b8 = divpd(auStack_414b8,auVar24);
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[1] = 0.0;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[2] = 4.94065645841247e-324;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[3] = 1.48219693752374e-323;
    DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41228;
    DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41208;
    auStack_40f88 = (undefined1  [8])auStack_41508;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[0] = (double)auStack_41508;
    auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
    auStack_10038._8_8_ = &DStack_41188;
    paStack_10028 = (assign_op<double,_double> *)adStack_41038;
    pEStack_10020 = &EStack_38c68;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)auStack_10038);
    Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
    if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array[3] +
         (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array[1] == 6) &&
       (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] == 4.94065645841247e-324)) {
      auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41508;
      auVar25._0_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&EStack_38c68);
      auVar25._8_8_ = 0;
      auVar23 = sqrtpd(auVar25,auVar25);
      auVar26._0_8_ = auVar23._0_8_;
      auVar26._8_8_ = auVar26._0_8_;
      auStack_41508 = divpd(auStack_41508,auVar26);
      auStack_414f8 = divpd(auStack_414f8,auVar26);
      auStack_414e8 = divpd(auStack_414e8,auVar26);
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[1] = 0.0;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[2] = 4.94065645841247e-324;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[3] = 1.48219693752374e-323;
      DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41268;
      DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41248;
      auStack_40f88 = (undefined1  [8])auStack_41538;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[0] = (double)auStack_41538;
      auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
      auStack_10038._8_8_ = &DStack_41188;
      paStack_10028 = (assign_op<double,_double> *)adStack_41038;
      pEStack_10020 = &EStack_38c68;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)auStack_10038);
      Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
      if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array[3] +
           (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array[1] == 6) &&
         (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] == 4.94065645841247e-324)) {
        auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41538;
        auVar27._0_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                         *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)&EStack_38c68);
        auVar27._8_8_ = 0;
        auVar23 = sqrtpd(auVar27,auVar27);
        auVar28._0_8_ = auVar23._0_8_;
        auVar28._8_8_ = auVar28._0_8_;
        auStack_41538 = divpd(auStack_41538,auVar28);
        auStack_41528 = divpd(auStack_41528,auVar28);
        auStack_41518 = divpd(auStack_41518,auVar28);
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[1] = 0.0;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] = 4.94065645841247e-324;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[3] = 1.48219693752374e-323;
        DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_412a8;
        DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41288;
        auStack_40f88 = (undefined1  [8])auStack_41568;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[0] = (double)auStack_41568;
        auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
        auStack_10038._8_8_ = &DStack_41188;
        paStack_10028 = (assign_op<double,_double> *)adStack_41038;
        pEStack_10020 = &EStack_38c68;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)auStack_10038);
        Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
        if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array[3] +
             (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array[1] == 6) &&
           (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] == 4.94065645841247e-324)) {
          auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41568;
          auVar29._0_8_ =
               Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                           *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                           *)&EStack_38c68);
          auVar29._8_8_ = 0;
          auVar23 = sqrtpd(auVar29,auVar29);
          auVar30._0_8_ = auVar23._0_8_;
          auVar30._8_8_ = auVar30._0_8_;
          auStack_41568 = divpd(auStack_41568,auVar30);
          auStack_41558 = divpd(auStack_41558,auVar30);
          auStack_41548 = divpd(auStack_41548,auVar30);
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[1] = 0.0;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] = 4.94065645841247e-324;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[3] = 1.48219693752374e-323;
          DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
               (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_412e8;
          DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
               (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_412c8;
          auStack_40f88 = (undefined1  [8])auStack_41598;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[0] = (double)auStack_41598;
          auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
          auStack_10038._8_8_ = &DStack_41188;
          paStack_10028 = (assign_op<double,_double> *)adStack_41038;
          pEStack_10020 = &EStack_38c68;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)auStack_10038);
          Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
          if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array[3] +
               (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array[1] == 6) &&
             (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2] == 4.94065645841247e-324)) {
            auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41598;
            auVar31._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                             *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)&EStack_38c68);
            auVar31._8_8_ = 0;
            auVar23 = sqrtpd(auVar31,auVar31);
            auVar32._0_8_ = auVar23._0_8_;
            auVar32._8_8_ = auVar32._0_8_;
            auStack_41598 = divpd(auStack_41598,auVar32);
            auStack_41588 = divpd(auStack_41588,auVar32);
            auStack_41578 = divpd(auStack_41578,auVar32);
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[1] = 0.0;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] = 4.94065645841247e-324;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[3] = 1.48219693752374e-323;
            DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data
                 = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41328;
            DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data
                 = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41308;
            auStack_40f88 = (undefined1  [8])auStack_415c8;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[0] = (double)auStack_415c8;
            auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
            auStack_10038._8_8_ = &DStack_41188;
            paStack_10028 = (assign_op<double,_double> *)adStack_41038;
            pEStack_10020 = &EStack_38c68;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)auStack_10038);
            Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                       (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
            if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
                       .m_storage.m_data.array[3] +
                 (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
                       .m_storage.m_data.array[1] == 6) &&
               (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] == 4.94065645841247e-324)) {
              auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_415c8;
              auVar33._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                               *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                               *)&EStack_38c68);
              auVar33._8_8_ = 0;
              auVar23 = sqrtpd(auVar33,auVar33);
              auVar34._0_8_ = auVar23._0_8_;
              auVar34._8_8_ = auVar34._0_8_;
              auStack_415c8 = divpd(auStack_415c8,auVar34);
              auStack_415b8 = divpd(auStack_415b8,auVar34);
              auStack_415a8 = divpd(auStack_415a8,auVar34);
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1] = 0.0;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2] = 4.94065645841247e-324;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[3] = 1.48219693752374e-323;
              DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41368;
              DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41348;
              auStack_40f88 = (undefined1  [8])auStack_415f8;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0] = (double)auStack_415f8;
              auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
              auStack_10038._8_8_ = &DStack_41188;
              paStack_10028 = (assign_op<double,_double> *)adStack_41038;
              pEStack_10020 = &EStack_38c68;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)auStack_10038);
              Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
              if (((long)MStack_40c68.
                         super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array[3] +
                   (long)MStack_40c68.
                         super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array[1] == 6) &&
                 (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_415f8;
                auVar35._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                 *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                 *)&EStack_38c68);
                auVar35._8_8_ = 0;
                auVar23 = sqrtpd(auVar35,auVar35);
                auVar36._0_8_ = auVar23._0_8_;
                auVar36._8_8_ = auVar36._0_8_;
                auStack_415f8 = divpd(auStack_415f8,auVar36);
                auStack_415e8 = divpd(auStack_415e8,auVar36);
                auStack_415d8 = divpd(auStack_415d8,auVar36);
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1] = 0.0;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] = 4.94065645841247e-324;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3] = 1.48219693752374e-323;
                DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
                data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_413a8;
                DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
                data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41388;
                auStack_40f88 = (undefined1  [8])auStack_41628;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[0] = (double)auStack_41628;
                auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
                auStack_10038._8_8_ = &DStack_41188;
                paStack_10028 = (assign_op<double,_double> *)adStack_41038;
                pEStack_10020 = &EStack_38c68;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)auStack_10038);
                Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                           (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                if (((long)MStack_40c68.
                           super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                           m_storage.m_data.array[3] +
                     (long)MStack_40c68.
                           super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                           m_storage.m_data.array[1] == 6) &&
                   (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                  auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41628;
                  auVar37._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                   *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                   *)&EStack_38c68);
                  auVar37._8_8_ = 0;
                  auVar23 = sqrtpd(auVar37,auVar37);
                  auVar38._0_8_ = auVar23._0_8_;
                  auVar38._8_8_ = auVar38._0_8_;
                  auStack_41628 = divpd(auStack_41628,auVar38);
                  auStack_41618 = divpd(auStack_41618,auVar38);
                  auStack_41608 = divpd(auStack_41608,auVar38);
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1] = 0.0;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] = 4.94065645841247e-324;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3] = 1.48219693752374e-323;
                  DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_413e8;
                  DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_413c8;
                  auStack_40f88 = (undefined1  [8])auStack_41658;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[0] = (double)auStack_41658;
                  auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
                  auStack_10038._8_8_ = &DStack_41188;
                  paStack_10028 = (assign_op<double,_double> *)adStack_41038;
                  pEStack_10020 = &EStack_38c68;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)auStack_10038);
                  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                  if (((long)MStack_40c68.
                             super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array[3] +
                       (long)MStack_40c68.
                             super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array[1] == 6) &&
                     (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                    auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41658;
                    auVar39._0_8_ =
                         Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                     *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                     *)&EStack_38c68);
                    auVar39._8_8_ = 0;
                    auVar23 = sqrtpd(auVar39,auVar39);
                    auVar40._0_8_ = auVar23._0_8_;
                    auVar40._8_8_ = auVar40._0_8_;
                    auStack_41658 = divpd(auStack_41658,auVar40);
                    auStack_41648 = divpd(auStack_41648,auVar40);
                    auStack_41638 = divpd(auStack_41638,auVar40);
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1] = 0.0;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] = 4.94065645841247e-324;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3] = 1.48219693752374e-323;
                    DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                    m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41428;
                    DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                    m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41408;
                    auStack_40f88 = (undefined1  [8])auStack_41688;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[0] = (double)auStack_41688;
                    auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
                    auStack_10038._8_8_ = &DStack_41188;
                    paStack_10028 = (assign_op<double,_double> *)adStack_41038;
                    pEStack_10020 = &EStack_38c68;
                    Eigen::internal::
                    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)auStack_10038);
                    Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                    if (((long)MStack_40c68.
                               super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                               m_storage.m_data.array[3] +
                         (long)MStack_40c68.
                               super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                               m_storage.m_data.array[1] == 6) &&
                       (MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[2] == 4.94065645841247e-324)) {
                      auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41688;
                      auVar41._0_8_ =
                           Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                       *)auStack_10038,
                                      (scalar_sum_op<double,_double> *)&MStack_40c68,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                       *)&EStack_38c68);
                      auVar41._8_8_ = 0;
                      auVar23 = sqrtpd(auVar41,auVar41);
                      auVar42._0_8_ = auVar23._0_8_;
                      auVar42._8_8_ = auVar42._0_8_;
                      auStack_41688 = divpd(auStack_41688,auVar42);
                      auStack_41678 = divpd(auStack_41678,auVar42);
                      auStack_41668 = divpd(auStack_41668,auVar42);
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1] = 0.0;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] = 4.94065645841247e-324;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3] = 1.48219693752374e-323;
                      DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41468;
                      DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&uStack_41448;
                      auStack_40f88 = (undefined1  [8])auStack_416b8;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[0] = (double)auStack_416b8;
                      auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
                      auStack_10038._8_8_ = &DStack_41188;
                      paStack_10028 = (assign_op<double,_double> *)adStack_41038;
                      pEStack_10020 = &EStack_38c68;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)auStack_10038);
                      Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                      if (((long)MStack_40c68.
                                 super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                 m_storage.m_data.array[3] +
                           (long)MStack_40c68.
                                 super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                 m_storage.m_data.array[1] == 6) &&
                         (MStack_40c68.
                          super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
                          .m_data.array[2] == 4.94065645841247e-324)) {
                        auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_416b8;
                        auVar43._0_8_ =
                             Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                         *)auStack_10038,
                                        (scalar_sum_op<double,_double> *)&MStack_40c68,
                                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                         *)&EStack_38c68);
                        auVar43._8_8_ = 0;
                        auVar23 = sqrtpd(auVar43,auVar43);
                        auVar44._0_8_ = auVar23._0_8_;
                        auVar44._8_8_ = auVar44._0_8_;
                        auStack_416b8 = divpd(auStack_416b8,auVar44);
                        auStack_416a8 = divpd(auStack_416a8,auVar44);
                        auStack_41698 = divpd(auStack_41698,auVar44);
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[1] = 0.0;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[2] = 4.94065645841247e-324;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[3] = 1.48219693752374e-323;
                        DStack_41188.lhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&dStack_414a8;
                        DStack_41188.rhsImpl.super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)&dStack_41488;
                        auStack_40f88 = (undefined1  [8])auStack_41068;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[0] = (double)auStack_41068;
                        auStack_10038._0_8_ = (DstEvaluatorType *)auStack_40f88;
                        auStack_10038._8_8_ = &DStack_41188;
                        paStack_10028 = (assign_op<double,_double> *)adStack_41038;
                        pEStack_10020 = &EStack_38c68;
                        Eigen::internal::
                        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                               *)auStack_10038);
                        auVar46._0_8_ = dStack_41498 * dStack_41480 - dStack_41478 * dStack_414a0;
                        auVar46._8_8_ = dStack_414a8 * dStack_41478 - dStack_41488 * dStack_41498;
                        Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)
                                   &MStack_40c68,
                                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68
                                  );
                        if (((long)MStack_40c68.
                                   super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                   m_storage.m_data.array[3] +
                             (long)MStack_40c68.
                                   super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                   m_storage.m_data.array[1] == 6) &&
                           (MStack_40c68.
                            super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                            m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                          auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41068;
                          auVar45._0_8_ =
                               Eigen::internal::
                               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                               ::
                               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                           *)auStack_10038,
                                          (scalar_sum_op<double,_double> *)&MStack_40c68,
                                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                           *)&EStack_38c68);
                          auVar45._8_8_ = 0;
                          auVar23 = sqrtpd(auVar46,auVar45);
                          auVar47._0_8_ = auVar23._0_8_;
                          auVar47._8_8_ = auVar47._0_8_;
                          auStack_41068 = divpd(auStack_41068,auVar47);
                          auStack_41058 = divpd(auStack_41058,auVar47);
                          auStack_41048 = divpd(auStack_41048,auVar47);
                          auStack_40f88 = (undefined1  [8])auStack_414d8._0_8_;
                          adStack_40f80[0] = (double)auStack_414d8._8_8_;
                          adStack_40f80[1] = (double)auStack_414c8._0_8_;
                          adStack_40f80[2] = (double)auStack_414c8._8_8_;
                          adStack_40f80[3] = (double)auStack_414b8._0_8_;
                          uStack_40f60 = auStack_414b8._8_8_;
                          DStack_41188._0_8_ = auStack_41508._0_8_;
                          DStack_41188.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41508._8_8_;
                          DStack_41188.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_414f8._0_8_;
                          uStack_41170 = auStack_414f8._8_8_;
                          uStack_41168 = auStack_414e8._0_8_;
                          uStack_41160 = auStack_414e8._8_8_;
                          DStack_40f58._0_8_ = auStack_41538._0_8_;
                          DStack_40f58.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41538._8_8_;
                          DStack_40f58.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41528._0_8_;
                          uStack_40f40 = auStack_41528._8_8_;
                          uStack_40f38 = auStack_41518._0_8_;
                          uStack_40f30 = auStack_41518._8_8_;
                          DStack_41158._0_8_ = auStack_41568._0_8_;
                          DStack_41158.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41568._8_8_;
                          DStack_41158.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41558._0_8_;
                          uStack_41140 = auStack_41558._8_8_;
                          uStack_41138 = auStack_41548._0_8_;
                          uStack_41130 = auStack_41548._8_8_;
                          DStack_40f28._0_8_ = auStack_41598._0_8_;
                          DStack_40f28.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41598._8_8_;
                          DStack_40f28.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41588._0_8_;
                          uStack_40f10 = auStack_41588._8_8_;
                          uStack_40f08 = auStack_41578._0_8_;
                          uStack_40f00 = auStack_41578._8_8_;
                          DStack_41128._0_8_ = auStack_415c8._0_8_;
                          DStack_41128.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_415c8._8_8_;
                          DStack_41128.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_415b8._0_8_;
                          uStack_41110 = auStack_415b8._8_8_;
                          uStack_41108 = auStack_415a8._0_8_;
                          uStack_41100 = auStack_415a8._8_8_;
                          DStack_40ef8._0_8_ = auStack_415f8._0_8_;
                          DStack_40ef8.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_415f8._8_8_;
                          DStack_40ef8.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_415e8._0_8_;
                          uStack_40ee0 = auStack_415e8._8_8_;
                          uStack_40ed8 = auStack_415d8._0_8_;
                          uStack_40ed0 = auStack_415d8._8_8_;
                          DStack_410f8._0_8_ = auStack_41628._0_8_;
                          DStack_410f8.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41628._8_8_;
                          DStack_410f8.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41618._0_8_;
                          uStack_410e0 = auStack_41618._8_8_;
                          uStack_410d8 = auStack_41608._0_8_;
                          uStack_410d0 = auStack_41608._8_8_;
                          DStack_40ec8._0_8_ = auStack_41658._0_8_;
                          DStack_40ec8.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41658._8_8_;
                          DStack_40ec8.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41648._0_8_;
                          uStack_40eb0 = auStack_41648._8_8_;
                          uStack_40ea8 = auStack_41638._0_8_;
                          uStack_40ea0 = auStack_41638._8_8_;
                          DStack_410c8._0_8_ = auStack_41688._0_8_;
                          DStack_410c8.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41688._8_8_;
                          DStack_410c8.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41678._0_8_;
                          uStack_410b0 = auStack_41678._8_8_;
                          uStack_410a8 = auStack_41668._0_8_;
                          uStack_410a0 = auStack_41668._8_8_;
                          DStack_40e98._0_8_ = auStack_416b8._0_8_;
                          DStack_40e98.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_416b8._8_8_;
                          DStack_40e98.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_416a8._0_8_;
                          uStack_40e80 = auStack_416a8._8_8_;
                          adStack_40e78[0] = (double)auStack_41698._0_8_;
                          adStack_40e78[1] = (double)auStack_41698._8_8_;
                          auStack_41098 = auStack_41068;
                          auStack_41088 = auStack_41058;
                          auStack_41078 = auStack_41048;
                          vStack_416d8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_416d8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_416d8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_416f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_416f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_416f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          lVar19 = 0x20;
                          do {
                            dVar1 = *(double *)((long)adStack_411b0 + lVar19 + 8);
                            dVar2 = *(double *)((long)adStack_411b0 + lVar19 + 0x10);
                            dVar3 = *(double *)((long)adStack_411b0 + lVar19 + 0x18);
                            dVar6 = *(double *)((long)adStack_411b0 + lVar19 + 0x20);
                            dVar7 = *(double *)
                                     ((long)&DStack_41188.lhsImpl.
                                             super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                             .m_d.data + lVar19);
                            if (vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                                          *)&vStack_416d8,
                                         (iterator)
                                         vStack_416d8.
                                         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_38c68);
                            }
                            else {
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[4] =
                                   *(double *)(&DStack_41188.field_0x0 + lVar19);
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[5] = dVar7;
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[2] = dVar3;
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[3] = dVar6;
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[0] = dVar1;
                              ((vStack_416d8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[1] = dVar2;
                              vStack_416d8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_416d8.
                                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            dVar1 = *(double *)((long)adStack_40fb0 + lVar19 + 8);
                            dVar2 = *(double *)((long)adStack_40fb0 + lVar19 + 0x10);
                            dVar3 = *(double *)((long)adStack_40fb0 + lVar19 + 0x18);
                            dVar6 = *(double *)((long)adStack_40fb0 + lVar19 + 0x20);
                            dVar7 = *(double *)((long)adStack_40f80 + lVar19);
                            if (vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                                          *)&vStack_416f8,
                                         (iterator)
                                         vStack_416f8.
                                         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_38c68);
                            }
                            else {
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[4] = *(double *)(auStack_40f88 + lVar19);
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[5] = dVar7;
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[2] = dVar3;
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[3] = dVar6;
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[0] = dVar1;
                              ((vStack_416f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[1] = dVar2;
                              vStack_416f8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_416f8.
                                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            lVar19 = lVar19 + 0x30;
                          } while (lVar19 != 0x140);
                          memset(&MStack_40c68,0,0x8000);
                          setupAction<double>(&vStack_416d8,&vStack_416f8,&MStack_40c68);
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0] = 1.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[3] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[4] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[5] = 1.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[6] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[7] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[8] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[9] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[10] = 1.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xb] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xc] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xd] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xe] = 0.0;
                          MStack_40e68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xf] = 1.0;
                          memset(&EStack_38c68.m_eivalues,0,0x402);
                          Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
                          compute<Eigen::Matrix<double,64,64,0,64,64>>
                                    ((EigenSolver<Eigen::Matrix<double,64,64,0,64,64>> *)
                                     &EStack_38c68,
                                     (EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)
                                     &MStack_40c68,true);
                          Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::
                          eigenvectors((EigenvectorsType *)auStack_10038,&EStack_38c68);
                          std::
                          vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ::reserve(__return_storage_ptr__,0x40);
                          puVar20 = local_fc70;
                          uVar15 = 0;
                          do {
                            uVar14 = 0;
                            bVar18 = false;
                            puVar21 = puVar20;
                            do {
                              if (0x3f < (uVar14 | uVar15)) {
                                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()"
                                              ,
                                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                              ,0x16f,
                                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>, 64, 64, 0, 64, 64>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<std::complex<double>, 64, 64, 0, 64, 64>, Level = 1]"
                                             );
                              }
                              auVar23 = __divdc3(puVar21[-1],*puVar21,auStack_fc48[uVar15 * 0x80],
                                                 auStack_fc48[uVar15 * 0x80 + 1]);
                              MStack_40d80.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[uVar14] = auVar23._0_8_;
                              bVar18 = (bool)(bVar18 | (NAN(auVar23._0_8_) ||
                                                       1e-06 <= ABS(auVar23._8_8_)));
                              uVar14 = uVar14 + 1;
                              puVar21 = puVar21 + 2;
                            } while (uVar14 != 3);
                            if (!bVar18) {
                              cayley2rot<double>(&MStack_40d80);
                              dStack_411d8 = adStack_41038[0];
                              dStack_411d0 = adStack_41038[3];
                              dStack_411c0 = adStack_41038[1];
                              dStack_411b8 = dStack_41018;
                              dStack_411c8 = dStack_41008;
                              adStack_411b0[0] = dStack_41000;
                              adStack_411b0[1] = adStack_41038[2];
                              adStack_411b0[2] = dStack_41010;
                              adStack_411b0[3] = dStack_40ff8;
                              lVar19 = 5;
                              lVar13 = 0;
                              do {
                                dVar7 = adStack_411b0[lVar19 + 3];
                                dVar8 = adStack_411b0[lVar19 + 4];
                                dVar1 = *(double *)(&DStack_41188.field_0x0 + lVar19 * 8);
                                dVar9 = adStack_411b0[lVar19];
                                dVar10 = adStack_411b0[lVar19 + 1];
                                dVar2 = adStack_411b0[lVar19 + 2];
                                dVar11 = adStack_40fb0[lVar19];
                                dVar4 = adStack_40fb0[lVar19 + 1];
                                dVar3 = adStack_40fb0[lVar19 + 2];
                                dVar48 = dVar3 * adStack_41038[2] +
                                         dVar4 * adStack_41038[1] + dVar11 * adStack_41038[0];
                                dVar49 = dVar3 * dStack_41010 +
                                         dVar4 * dStack_41018 + dVar11 * adStack_41038[3];
                                dVar6 = dStack_41000 * dVar4 + dStack_40ff8 * dVar3 +
                                        dStack_41008 * dVar11;
                                adStack_40de8[lVar13] =
                                     -(*(double *)(auStack_40f88 + lVar19 * 8) *
                                       (dVar2 * dStack_40ff8 +
                                       dStack_41010 * dVar10 + adStack_41038[2] * dVar9) +
                                       adStack_40fb0[lVar19 + 4] *
                                       (dVar2 * dStack_41000 +
                                       dStack_41018 * dVar10 + adStack_41038[1] * dVar9) +
                                       adStack_40fb0[lVar19 + 3] *
                                       (dVar2 * dStack_41008 +
                                       adStack_41038[3] * dVar10 + adStack_41038[0] * dVar9) +
                                      dVar3 * (dVar1 * dStack_40ff8 +
                                              dVar8 * dStack_41010 + dVar7 * adStack_41038[2]) +
                                      (dVar1 * dStack_41000 +
                                      dVar8 * dStack_41018 + dVar7 * adStack_41038[1]) * dVar4 +
                                      (dVar1 * dStack_41008 +
                                      dVar8 * adStack_41038[3] + dVar7 * adStack_41038[0]) * dVar11)
                                ;
                                adStack_40cf8[lVar13] = dVar2 * dVar49 - dVar6 * dVar10;
                                adStack_40cc8[lVar13] = dVar9 * dVar6 - dVar2 * dVar48;
                                adStack_40c98[lVar13] = dVar48 * dVar10 - dVar49 * dVar9;
                                lVar13 = lVar13 + 1;
                                lVar19 = lVar19 + 6;
                              } while (lVar13 != 6);
                              SStack_411f0.m_xpr.m_lhs.m_matrix = (non_const_type)adStack_40cf8;
                              SStack_411f0.m_xpr.m_rhs = SStack_411f0.m_xpr.m_lhs.m_matrix;
                              pdStack_411e0 = (double *)SStack_411f0.m_xpr.m_lhs.m_matrix;
                              Eigen::internal::
                              Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                              ::run(&MStack_40d68,&SStack_411f0,
                                    (assign_op<double,_double> *)adStack_41038);
                              dVar11 = MStack_40d68.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                       m_storage.m_data.array[8];
                              dVar10 = MStack_40d68.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                       m_storage.m_data.array[7];
                              dVar9 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[6];
                              dVar8 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[5];
                              dVar7 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[4];
                              dVar6 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[3];
                              dVar3 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[2];
                              dVar2 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[1];
                              dVar1 = MStack_40d68.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[0];
                              pMStack_40d20 = (non_const_type)pdStack_411e0;
                              lVar19 = 2;
                              pdVar12 = pdStack_411e0;
                              do {
                                dVar4 = *pdVar12;
                                dVar48 = pdVar12[6];
                                dVar49 = pdVar12[0xc];
                                *(double *)(auStack_41048 + lVar19 * 8) =
                                     dVar49 * dVar9 + dVar48 * dVar6 + dVar4 * dVar1;
                                *(double *)(auStack_41048 + lVar19 * 8 + 8) =
                                     dVar49 * dVar10 + dVar48 * dVar7 + dVar4 * dVar2;
                                adStack_41038[lVar19] =
                                     dVar49 * dVar11 + dVar8 * dVar48 + dVar3 * dVar4;
                                lVar19 = lVar19 + 3;
                                pdVar12 = pdVar12 + 1;
                              } while (lVar19 != 0x14);
                              lVar19 = 0x10;
                              pdVar12 = &dStack_411c8;
                              do {
                                dVar1 = pdVar12[-1];
                                *(double *)((long)adStack_40e78 + lVar19) = pdVar12[-2];
                                *(double *)
                                 ((long)MStack_40e68.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array + lVar19 + -8) = dVar1;
                                *(double *)
                                 ((long)MStack_40e68.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array + lVar19) = *pdVar12;
                                pdVar12 = pdVar12 + 3;
                                lVar19 = lVar19 + 0x20;
                              } while (lVar19 != 0x70);
                              MStack_40e68.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xc] =
                                   dStack_40fc0 * adStack_40de8[5] +
                                   adStack_41038[0] * adStack_40de8[0] +
                                   adStack_40de8[1] * adStack_41038[3] +
                                   adStack_40de8[2] * dStack_41008 + adStack_40de8[3] * dStack_40ff0
                                   + adStack_40de8[4] * dStack_40fd8;
                              MStack_40e68.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xd] =
                                   dStack_40fb8 * adStack_40de8[5] +
                                   adStack_41038[1] * adStack_40de8[0] +
                                   adStack_40de8[1] * dStack_41018 + adStack_40de8[2] * dStack_41000
                                   + adStack_40de8[3] * dStack_40fe8 +
                                   adStack_40de8[4] * dStack_40fd0;
                              MStack_40e68.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xe] =
                                   adStack_40de8[0] * adStack_41038[2] +
                                   adStack_40de8[2] * dStack_40ff8 + adStack_40de8[1] * dStack_41010
                                   + adStack_40de8[5] * adStack_40fb0[0] +
                                     adStack_40de8[4] * dStack_40fc8 +
                                     adStack_40de8[3] * dStack_40fe0;
                              __position._M_current =
                                   (__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                              if (__position._M_current ==
                                  (__return_storage_ptr__->
                                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::
                                vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                                ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                                          ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                                            *)__return_storage_ptr__,__position,&MStack_40e68);
                              }
                              else {
                                pMVar16 = &MStack_40e68;
                                iVar17._M_current = __position._M_current;
                                for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
                                  ((iVar17._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array[0] =
                                       (pMVar16->
                                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                                       .m_storage.m_data.array[0];
                                  pMVar16 = (Matrix<double,_4,_4,_0,_4,_4> *)
                                            ((long)pMVar16 + ((ulong)bVar22 * -2 + 1) * 8);
                                  iVar17._M_current =
                                       (Matrix<double,_4,_4,_0,_4,_4> *)
                                       ((long)iVar17._M_current + ((ulong)bVar22 * -2 + 1) * 8);
                                }
                                (__return_storage_ptr__->
                                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish =
                                     __position._M_current + 1;
                              }
                            }
                            uVar15 = uVar15 + 1;
                            puVar20 = puVar20 + 0x80;
                          } while (uVar15 != 0x40);
                          if (vStack_416f8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_416f8.
                                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (vStack_416d8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_416d8.
                                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          return __return_storage_ptr__;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 6, 1>>::finished() [MatrixType = Eigen::Matrix<double, 6, 1>]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}